

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

int run_with_handle(function<int_(_qpdfjob_handle_*)> *fn)

{
  int iVar1;
  qpdfjob_handle __args;
  qpdfjob_handle j;
  qpdfjob_handle local_20;
  
  __args = qpdfjob_init();
  local_20 = __args;
  iVar1 = std::function<int_(_qpdfjob_handle_*)>::operator()(fn,__args);
  if (iVar1 == 0) {
    iVar1 = qpdfjob_run(__args);
  }
  qpdfjob_cleanup(&local_20);
  return iVar1;
}

Assistant:

static int
run_with_handle(std::function<int(qpdfjob_handle)> fn)
{
    auto j = qpdfjob_init();
    int status = fn(j);
    if (status == 0) {
        status = qpdfjob_run(j);
    }
    qpdfjob_cleanup(&j);
    return status;
}